

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::GetString
          (ExtensionSet *this,int number,string *default_value)

{
  byte bVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  LogFinisher local_c9;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  pEVar2 = FindOrNull(this,number);
  if ((pEVar2 != (Extension *)0x0) && ((pEVar2->field_0xa & 1) == 0)) {
    if (pEVar2->is_repeated != false) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x237);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_90,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    bVar1 = pEVar2->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar3 = LogMessage::operator<<
                         (&local_90,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_c8,pLVar3);
      LogMessage::~LogMessage(&local_90);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x237);
      pLVar3 = LogMessage::operator<<
                         (&local_c8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_c9,pLVar3);
      LogMessage::~LogMessage(&local_c8);
    }
    default_value = (string *)(pEVar2->field_0).int64_t_value;
  }
  return default_value;
}

Assistant:

const std::string& ExtensionSet::GetString(
    int number, const std::string& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
    return *extension->string_value;
  }
}